

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::IfcSlab(IfcSlab *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcSlab";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__0099efd8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x99eea8;
  *(undefined8 *)&this->field_0x180 = 0x99efc0;
  *(undefined8 *)&this->field_0x88 = 0x99eed0;
  *(undefined8 *)&this->field_0x98 = 0x99eef8;
  *(undefined8 *)&this->field_0xd0 = 0x99ef20;
  *(undefined8 *)&this->field_0x100 = 0x99ef48;
  *(undefined8 *)&this->field_0x138 = 0x99ef70;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x99ef98;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}